

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::ParseLinedef(UDMFParser *this,line_t *ld,int index)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  byte *pbVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  DWORD DVar6;
  FName FVar7;
  bool bVar8;
  int iVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  long lVar10;
  undefined7 extraout_var_01;
  char *pcVar11;
  uint uVar12;
  DWORD *pDVar13;
  FString *this_00;
  double dVar14;
  undefined1 auVar15 [16];
  FString tagstring;
  FString arg1str;
  FString arg0str;
  FString local_168;
  FName local_15c;
  char *local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  side_t **local_138;
  FName key;
  int local_120;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  arg0str.Chars = FString::NullString.Nothing;
  arg1str.Chars = FString::NullString.Nothing;
  tagstring.Chars = FString::NullString.Nothing;
  uVar12 = 0;
  memset(ld,0,0x98);
  ld->alpha = 1.0;
  ld->portalindex = 0xffffffff;
  ld->sidedef[0] = (side_t *)0x0;
  DVar6 = level.flags2;
  ld->sidedef[1] = (side_t *)0x0;
  if ((level.flags2 >> 9 & 1) != 0) {
    ld->flags = 0x80000;
    uVar12 = 0x80000;
  }
  if ((DVar6 >> 10 & 1) != 0) {
    uVar12 = uVar12 | 0x100000;
    ld->flags = uVar12;
  }
  if ((DVar6 >> 0xb & 1) != 0) {
    ld->flags = uVar12 | 0x400000;
  }
  FScanner::MustGetToken((FScanner *)this,0x7b);
  local_138 = ld->sidedef;
  pDVar1 = &ld->flags;
  pDVar2 = &ld->activation;
  local_140 = 0;
  local_148 = 0;
  local_150 = 0;
LAB_004e58ef:
  bVar8 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar8) {
    if (*(int *)(tagstring.Chars + -0xc) != 0) {
      FScanner::FScanner((FScanner *)&key);
      FString::AttachToOther(&local_168,&tagstring);
      FScanner::OpenString((FScanner *)&key,"tagstring",&local_168);
      FString::~FString(&local_168);
      while (bVar8 = FScanner::CheckNumber((FScanner *)&key), bVar8) {
        if (local_120 != 0) {
          FTagManager::AddLineID(&tagManager,index,local_120);
        }
      }
      FScanner::~FScanner((FScanner *)&key);
    }
    if (this->isTranslated == true) {
      uVar12 = ld->flags;
      key.Index = 0;
      uVar4 = ld->special;
      uVar5 = ld->args[0];
      auVar15._4_4_ = uVar5;
      auVar15._0_4_ = uVar4;
      auVar15._8_8_ = 0;
      pshuflw(auVar15,auVar15,0xe8);
      P_TranslateLineDef(ld,(maplinedef_t *)&key,-1);
      *pDVar1 = *pDVar1 & 0x802200 | uVar12;
    }
    if (((local_150 & 1) != 0) && ((*pDVar2 & 2) != 0)) {
      *pDVar2 = *pDVar2 & 0xffffffbd | 0x40;
    }
    if ((((local_148 & 1) != 0) && (ld->alpha == 1.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.75;
    }
    if ((((local_140 & 1) != 0) && (ld->alpha == 65536.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.25;
    }
    if (*local_138 == (side_t *)0x0) {
      *local_138 = (side_t *)0x1;
      Printf("Line %d has no first side.\n",(ulong)(uint)index);
    }
    if ((*(int *)(arg0str.Chars + -0xc) != 0) &&
       (((iVar9 = ld->special, iVar9 - 0x50U < 6 || (iVar9 == 0xe2)) || (iVar9 == 0)))) {
      FName::FName(&key,&arg0str);
      ld->args[0] = -key.Index;
    }
    if (*(int *)(arg1str.Chars + -0xc) != 0) {
      uVar12 = ld->special - 0x86;
      if (((uVar12 < 0x2d) && ((0x12000000002fU >> ((ulong)uVar12 & 0x3f) & 1) != 0)) ||
         (ld->special == 0)) {
        FName::FName(&key,&arg1str);
        ld->args[1] = -key.Index;
      }
    }
    if ((*pDVar1 & 0x10200000) == 0x10000000) {
      Printf("Line %d has midtex3dimpassible without midtex3d.\n",(ulong)(uint)index);
    }
    FString::~FString(&tagstring);
    FString::~FString(&arg1str);
    FString::~FString(&arg0str);
    return;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x0);
  pDVar13 = pDVar1;
  switch(key.Index) {
  case 0x14d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_004e5928_caseD_14e;
    bVar8 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x14d].Text);
    local_148 = CONCAT71(extraout_var,bVar8);
    goto LAB_004e58ef;
  case 0x14e:
  case 0x14f:
  case 0x150:
  case 0x151:
  case 0x152:
  case 0x153:
  case 0x154:
  case 0x155:
  case 0x156:
  case 0x157:
  case 0x158:
  case 0x162:
  case 0x163:
  case 0x164:
  case 0x165:
  case 0x168:
  case 0x169:
  case 0x16a:
  case 0x16b:
  case 0x16c:
    goto switchD_004e5928_caseD_14e;
  case 0x159:
    lVar10 = 0x1590;
    goto LAB_004e5add;
  case 0x15a:
    lVar10 = 0x15a0;
    goto LAB_004e5ab3;
  case 0x15b:
    lVar10 = 0x15b0;
    goto LAB_004e5aa6;
  case 0x15c:
    lVar10 = 0x15c0;
    goto LAB_004e5a99;
  case 0x15d:
    lVar10 = 0x15d0;
    goto LAB_004e5a7f;
  case 0x15e:
    lVar10 = 0x15e0;
    goto LAB_004e5a63;
  case 0x15f:
    lVar10 = 0x15f0;
    iVar9 = 0x40;
    break;
  case 0x160:
    iVar9 = 0x80;
    lVar10 = 0x1600;
    break;
  case 0x161:
    iVar9 = 0x100;
    lVar10 = 0x1610;
    break;
  case 0x166:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_004e5928_caseD_14e;
    iVar9 = 0x20000;
    lVar10 = 0x1660;
    break;
  case 0x167:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_004e5928_caseD_14e;
    iVar9 = 0x40000;
    lVar10 = 0x1670;
    break;
  case 0x16d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_004e5928_caseD_14e;
    bVar8 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x16d].Text);
    local_140 = CONCAT71(extraout_var_00,bVar8);
    goto LAB_004e58ef;
  case 0x16e:
    if (((this->super_UDMFParserBase).namespace_bits & 0x71) == 0) goto switchD_004e5928_caseD_14e;
    bVar8 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x16e].Text);
    local_150 = CONCAT71(extraout_var_01,bVar8);
    goto LAB_004e58ef;
  default:
    switch(key.Index) {
    case 0x10c:
    case 0x10d:
    case 0x10e:
    case 0x10f:
    case 0x110:
      iVar9 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[(uint)key.Index].Text
                        );
      *(int *)((long)ld + (long)key.Index * 4 + -0x404) = iVar9;
      goto LAB_004e58ef;
    case 0x111:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x111].Text);
        this_00 = &arg0str;
LAB_004e5cdc:
        FString::operator=(this_00,pcVar11);
        goto LAB_004e58ef;
      }
      break;
    case 0x112:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x112].Text);
        this_00 = &arg1str;
        goto LAB_004e5cdc;
      }
      break;
    case 0x113:
      iVar9 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x113].Text);
      FTagManager::AddLineID(&tagManager,index,iVar9);
      goto LAB_004e58ef;
    case 0x114:
      break;
    case 0x115:
      iVar9 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x115].Text);
      ld->v1 = (vertex_t *)(long)iVar9;
      goto LAB_004e58ef;
    case 0x116:
      iVar9 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x116].Text);
      ld->v2 = (vertex_t *)(long)iVar9;
      goto LAB_004e58ef;
    case 0x117:
      iVar9 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x117].Text);
      *local_138 = (side_t *)(long)(iVar9 + 1);
      goto LAB_004e58ef;
    case 0x118:
      iVar9 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x118].Text);
      ld->sidedef[1] = (side_t *)(long)(iVar9 + 1);
      goto LAB_004e58ef;
    default:
      if (key.Index != 0xe6) break;
      uVar12 = UDMFParserBase::CheckInt
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0xe6].Text);
      ld->special = uVar12;
      if (((this->super_UDMFParserBase).namespc.Index == 10) &&
         ((0x8c < uVar12 || ("\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar12] == '\0')))) {
        ld->special = 0;
      }
      goto LAB_004e58ef;
    }
switchD_004e5928_caseD_14e:
    if (this->isTranslated == false) {
      switch(key.Index) {
      case 0x16f:
        iVar9 = 0x200;
        lVar10 = 0x16f0;
        break;
      default:
        goto switchD_004e5c07_caseD_170;
      case 0x173:
        lVar10 = 0x1730;
        pDVar13 = pDVar2;
LAB_004e5add:
        iVar9 = 1;
        break;
      case 0x174:
        lVar10 = 0x1740;
        pDVar13 = pDVar2;
LAB_004e5ab3:
        iVar9 = 2;
        break;
      case 0x175:
        iVar9 = 0x400;
        lVar10 = 0x1750;
        pDVar13 = pDVar2;
        break;
      case 0x176:
        lVar10 = 0x1760;
        pDVar13 = pDVar2;
LAB_004e5aa6:
        iVar9 = 4;
        break;
      case 0x177:
        lVar10 = 6000;
        pDVar13 = pDVar2;
LAB_004e5a99:
        iVar9 = 8;
        break;
      case 0x178:
        lVar10 = 0x1780;
        pDVar13 = pDVar2;
LAB_004e5a7f:
        iVar9 = 0x10;
        break;
      case 0x179:
        lVar10 = 0x1790;
        pDVar13 = pDVar2;
LAB_004e5a63:
        iVar9 = 0x20;
        break;
      case 0x17b:
        iVar9 = 0x100;
        lVar10 = 0x17b0;
        pDVar13 = pDVar2;
        break;
      case 0x17c:
        iVar9 = 0x200;
        lVar10 = 0x17c0;
        pDVar13 = pDVar2;
      }
      break;
    }
switchD_004e5c07_caseD_170:
    uVar12 = (this->super_UDMFParserBase).namespace_bits;
    if ((uVar12 & 0x70) == 0) goto switchD_004e5bdd_caseD_166;
    switch(key.Index) {
    case 0x162:
      iVar9 = 0x2000;
      lVar10 = 0x1620;
      break;
    case 0x163:
      iVar9 = 0x4000;
      lVar10 = 0x1630;
      break;
    case 0x164:
      iVar9 = 0x8000;
      lVar10 = 0x1640;
      break;
    case 0x165:
      iVar9 = 0x10000;
      lVar10 = 0x1650;
      break;
    case 0x166:
    case 0x167:
    case 0x16d:
    case 0x16e:
    case 0x16f:
    case 0x170:
    case 0x173:
    case 0x174:
    case 0x175:
    case 0x176:
    case 0x177:
    case 0x178:
    case 0x179:
      goto switchD_004e5bdd_caseD_166;
    case 0x168:
      iVar9 = 0x80000;
      lVar10 = 0x1680;
      break;
    case 0x169:
      iVar9 = 0x100000;
      lVar10 = 0x1690;
      break;
    case 0x16a:
      iVar9 = 0x200000;
      lVar10 = 0x16a0;
      break;
    case 0x16b:
      iVar9 = 0x400000;
      lVar10 = 0x16b0;
      break;
    case 0x16c:
      iVar9 = 0x800000;
      lVar10 = 0x16c0;
      break;
    case 0x171:
      iVar9 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x171].Text);
      ld->locknumber = iVar9;
      goto LAB_004e58ef;
    case 0x172:
      iVar9 = 0x10000000;
      lVar10 = 0x1720;
      break;
    case 0x17a:
      iVar9 = 0x80;
      lVar10 = 0x17a0;
      pDVar13 = pDVar2;
      break;
    default:
      switch(key.Index) {
      case 0x1ad:
        iVar9 = 0x1000000;
        lVar10 = 0x1ad0;
        break;
      case 0x1ae:
        iVar9 = 0x2000000;
        lVar10 = 0x1ae0;
        break;
      case 0x1af:
        goto switchD_004e5bdd_caseD_166;
      case 0x1b0:
        iVar9 = 0x4000000;
        lVar10 = 0x1b00;
        break;
      case 0x1b1:
        iVar9 = 0x8000000;
        lVar10 = 0x1b10;
        break;
      case 0x1b2:
        local_158 = UDMFParserBase::CheckString
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b2].Text);
        iVar9 = strcasecmp(local_158,"translucent");
        if (iVar9 == 0) {
          pbVar3 = (byte *)((long)&ld->flags + 1);
          *pbVar3 = *pbVar3 & 0xfb;
        }
        else {
          iVar9 = strcasecmp(local_158,"add");
          if (iVar9 == 0) {
            pbVar3 = (byte *)((long)&ld->flags + 1);
            *pbVar3 = *pbVar3 | 4;
          }
          else {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Unknown value \"%s\" for \'renderstyle\'\n",local_158);
          }
        }
        goto LAB_004e58ef;
      default:
        if (key.Index == 0x114) {
          pcVar11 = UDMFParserBase::CheckString
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x114].Text);
          FString::operator=(&tagstring,pcVar11);
          uVar12 = (this->super_UDMFParserBase).namespace_bits;
        }
        else if (key.Index == 0xdf) {
          dVar14 = UDMFParserBase::CheckFloat
                             (&this->super_UDMFParserBase,FName::NameData.NameArray[0xdf].Text);
          ld->alpha = dVar14;
          goto LAB_004e58ef;
        }
switchD_004e5bdd_caseD_166:
        FVar7.Index = key.Index;
        if (((uVar12 & 0x30) != 0) &&
           (iVar9 = strncasecmp("user_",FName::NameData.NameArray[key.Index].Text,5), iVar9 == 0)) {
          local_15c.Index = FVar7.Index;
          AddUserKey(this,&local_15c,0,index);
        }
        goto LAB_004e58ef;
      }
    }
  }
  UDMFParserBase::Flag<unsigned_int>
            (&this->super_UDMFParserBase,pDVar13,iVar9,
             *(char **)((long)&(FName::NameData.NameArray)->Text + lVar10));
  goto LAB_004e58ef;
}

Assistant:

void ParseLinedef(line_t *ld, int index)
	{
		bool passuse = false;
		bool strifetrans = false;
		bool strifetrans2 = false;
		FString arg0str, arg1str;
		int lineid = -1;	// forZDoomTranslated namespace
		FString tagstring;

		memset(ld, 0, sizeof(*ld));
		ld->alpha = 1.;
		ld->portalindex = UINT_MAX;
		ld->sidedef[0] = ld->sidedef[1] = NULL;
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();

			// This switch contains all keys of the UDMF base spec
			switch(key)
			{
			case NAME_V1:
				ld->v1 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_V2:
				ld->v2 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_Special:
				ld->special = CheckInt(key);
				if (namespc == NAME_Hexen)
				{
					if (ld->special < 0 || ld->special > 140 || !HexenLineSpecialOk[ld->special])
						ld->special = 0;	// NULL all specials which don't exist in Hexen
				}

				continue;

			case NAME_Id:
				lineid = CheckInt(key);
				tagManager.AddLineID(index, lineid);
				continue;

			case NAME_Sidefront:
				ld->sidedef[0] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Sideback:
				ld->sidedef[1] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Arg0:
			case NAME_Arg1:
			case NAME_Arg2:
			case NAME_Arg3:
			case NAME_Arg4:
				ld->args[int(key)-int(NAME_Arg0)] = CheckInt(key);
				continue;

			case NAME_Arg0Str:
				CHECK_N(Zd);
				arg0str = CheckString(key);
				continue;

			case NAME_Arg1Str:
				CHECK_N(Zd);
				arg1str = CheckString(key);
				continue;

			case NAME_Blocking:
				Flag(ld->flags, ML_BLOCKING, key); 
				continue;

			case NAME_Blockmonsters:
				Flag(ld->flags, ML_BLOCKMONSTERS, key); 
				continue;

			case NAME_Twosided:
				Flag(ld->flags, ML_TWOSIDED, key); 
				continue;

			case NAME_Dontpegtop:
				Flag(ld->flags, ML_DONTPEGTOP, key); 
				continue;

			case NAME_Dontpegbottom:
				Flag(ld->flags, ML_DONTPEGBOTTOM, key); 
				continue;

			case NAME_Secret:
				Flag(ld->flags, ML_SECRET, key); 
				continue;

			case NAME_Blocksound:
				Flag(ld->flags, ML_SOUNDBLOCK, key); 
				continue;

			case NAME_Dontdraw:
				Flag(ld->flags, ML_DONTDRAW, key); 
				continue;

			case NAME_Mapped:
				Flag(ld->flags, ML_MAPPED, key); 
				continue;

			case NAME_Jumpover:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_RAILING, key); 
				continue;

			case NAME_Blockfloaters:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_BLOCK_FLOATERS, key); 
				continue;

			case NAME_Translucent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans = CheckBool(key); 
				continue;

			case NAME_Transparent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans2 = CheckBool(key); 
				continue;

			case NAME_Passuse:
				CHECK_N(Dm | Zd | Zdt | Va)
				passuse = CheckBool(key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys of the UDMF base spec which only apply to Hexen format specials
			if (!isTranslated) switch (key)
			{
			case NAME_Playercross:
				Flag(ld->activation, SPAC_Cross, key); 
				continue;

			case NAME_Playeruse:
				Flag(ld->activation, SPAC_Use, key); 
				continue;

			case NAME_Playeruseback:
				Flag(ld->activation, SPAC_UseBack, key); 
				continue;

			case NAME_Monstercross:
				Flag(ld->activation, SPAC_MCross, key); 
				continue;

			case NAME_Impact:
				Flag(ld->activation, SPAC_Impact, key); 
				continue;

			case NAME_Playerpush:
				Flag(ld->activation, SPAC_Push, key); 
				continue;

			case NAME_Missilecross:
				Flag(ld->activation, SPAC_PCross, key); 
				continue;

			case NAME_Monsteruse:
				Flag(ld->activation, SPAC_MUse, key); 
				continue;

			case NAME_Monsterpush:
				Flag(ld->activation, SPAC_MPush, key); 
				continue;

			case NAME_Repeatspecial:
				Flag(ld->flags, ML_REPEAT_SPECIAL, key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys which are ZDoom specific
			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
			case NAME_Alpha:
				ld->setAlpha(CheckFloat(key));
				continue;

			case NAME_Renderstyle:
			{
				const char *str = CheckString(key);
				if (!stricmp(str, "translucent")) ld->flags &= ~ML_ADDTRANS;
				else if (!stricmp(str, "add")) ld->flags |= ML_ADDTRANS;
				else sc.ScriptMessage("Unknown value \"%s\" for 'renderstyle'\n", str);
				continue;
			}

			case NAME_Anycross:
				Flag(ld->activation, SPAC_AnyCross, key); 
				continue;

			case NAME_Monsteractivate:
				Flag(ld->flags, ML_MONSTERSCANACTIVATE, key); 
				continue;

			case NAME_Blockplayers:
				Flag(ld->flags, ML_BLOCK_PLAYERS, key); 
				continue;

			case NAME_Blockeverything:
				Flag(ld->flags, ML_BLOCKEVERYTHING, key); 
				continue;

			case NAME_Zoneboundary:
				Flag(ld->flags, ML_ZONEBOUNDARY, key); 
				continue;

			case NAME_Clipmidtex:
				Flag(ld->flags, ML_CLIP_MIDTEX, key); 
				continue;

			case NAME_Wrapmidtex:
				Flag(ld->flags, ML_WRAP_MIDTEX, key); 
				continue;

			case NAME_Midtex3d:
				Flag(ld->flags, ML_3DMIDTEX, key); 
				continue;

			case NAME_Checkswitchrange:
				Flag(ld->flags, ML_CHECKSWITCHRANGE, key); 
				continue;

			case NAME_Firstsideonly:
				Flag(ld->flags, ML_FIRSTSIDEONLY, key); 
				continue;

			case NAME_blockprojectiles:
				Flag(ld->flags, ML_BLOCKPROJECTILE, key); 
				continue;

			case NAME_blockuse:
				Flag(ld->flags, ML_BLOCKUSE, key); 
				continue;

			case NAME_blocksight:
				Flag(ld->flags, ML_BLOCKSIGHT, key); 
				continue;
			
			case NAME_blockhitscan:
				Flag(ld->flags, ML_BLOCKHITSCAN, key); 
				continue;
			
			// [TP] Locks the special with a key
			case NAME_Locknumber:
				ld->locknumber = CheckInt(key);
				continue;

			// [TP] Causes a 3d midtex to behave like an impassible line
			case NAME_Midtex3dimpassible:
				Flag(ld->flags, ML_3DMIDTEX_IMPASS, key);
				continue;

			case NAME_MoreIds:
				// delay parsing of the tag string until parsing of the sector is complete
				// This ensures that the ID is always the first tag in the list.
				tagstring = CheckString(key);
				break;


			default:
				break;
			}


			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Line, index);
			}
		}

		if (tagstring.IsNotEmpty())
		{
			FScanner sc;
			sc.OpenString("tagstring", tagstring);
			// scan the string as long as valid numbers can be found
			while (sc.CheckNumber())
			{
				if (sc.Number != 0)	tagManager.AddLineID(index, sc.Number);
			}
		}

		if (isTranslated)
		{
			int saved = ld->flags;

			maplinedef_t mld;
			memset(&mld, 0, sizeof(mld));
			mld.special = ld->special;
			mld.tag = ld->args[0];
			P_TranslateLineDef(ld, &mld);
			ld->flags = saved | (ld->flags&(ML_MONSTERSCANACTIVATE|ML_REPEAT_SPECIAL|ML_FIRSTSIDEONLY));
		}
		if (passuse && (ld->activation & SPAC_Use)) 
		{
			ld->activation = (ld->activation & ~SPAC_Use) | SPAC_UseThrough;
		}
		if (strifetrans && ld->alpha == 1.)
		{
			ld->alpha = 0.75;
		}
		if (strifetrans2 && ld->alpha == OPAQUE)
		{
			ld->alpha = 0.25;
		}
		if (ld->sidedef[0] == NULL)
		{
			ld->sidedef[0] = (side_t*)(intptr_t)(1);
			Printf("Line %d has no first side.\n", index);
		}
		if (arg0str.IsNotEmpty() && (P_IsACSSpecial(ld->special) || ld->special == 0))
		{
			ld->args[0] = -FName(arg0str);
		}
		if (arg1str.IsNotEmpty() && (P_IsThingSpecial(ld->special) || ld->special == 0))
		{
			ld->args[1] = -FName(arg1str);
		}
		if ((ld->flags & ML_3DMIDTEX_IMPASS) && !(ld->flags & ML_3DMIDTEX)) // [TP]
		{
			Printf ("Line %d has midtex3dimpassible without midtex3d.\n", index);
		}
	}